

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void write_file_text(vector<unsigned_int,_std::allocator<unsigned_int>_> *nums,string *file_name)

{
  uint *puVar1;
  FILE *__stream;
  uint *num;
  uint *puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> content;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  string local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_40,(string *)file_name);
  __stream = (FILE *)fopen_or_fail(&local_40,"w");
  std::__cxx11::string::~string((string *)&local_40);
  puVar1 = (nums->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (nums->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    fprintf(__stream,"%u\n",(ulong)*puVar2);
  }
  fclose_or_fail((FILE *)__stream);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void write_file_text(std::vector<uint32_t>& nums, std::string file_name)
{
    std::vector<uint32_t> content;
    auto fd = fopen_or_fail(file_name, "w");
    for (auto& num : nums) {
        fprintf(fd, "%u\n", num);
    }
    fclose_or_fail(fd);
}